

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_fspic.cpp
# Opt level: O1

void __thiscall DHUDPicManager::DHUDPicManager(DHUDPicManager *this)

{
  DObject::DObject((DObject *)this);
  (this->super_DHUDMessage).SourceText = (char *)0x0;
  (this->super_DHUDMessage).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00868e48;
  (this->piclist).Array = (FHudPic *)0x0;
  (this->piclist).Most = 0;
  (this->piclist).Count = 0;
  (this->super_DHUDMessage).HUDWidth = 0;
  (this->super_DHUDMessage).HUDHeight = 0;
  this->basetrans = 0.8;
  (this->super_DHUDMessage).NumLines = 1;
  (this->super_DHUDMessage).HoldTics = 0;
  return;
}

Assistant:

DHUDPicManager::DHUDPicManager()
{
	HUDWidth=HUDHeight=0;
	basetrans=0.8f;
	//SetID(0xffffffff);
	NumLines=1;
	HoldTics=0;	// stay forever!
	//logtoconsole=false;
}